

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_writer.cpp
# Opt level: O3

FileEntryInfo * __thiscall
IsoWriter::getEntryByName(IsoWriter *this,string *name,FileTypes fileType)

{
  pointer pcVar1;
  int iVar2;
  FileEntryInfo *this_00;
  undefined4 extraout_var;
  FileEntryInfo *pFVar3;
  long lVar4;
  string *name_00;
  long lVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  string fileName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string local_50;
  
  splitStr_abi_cxx11_(&local_68,(name->_M_dataplus)._M_p,'/');
  this_00 = this->m_rootDirInfo;
  if (this_00 == (FileEntryInfo *)0x0) {
    pFVar3 = (FileEntryInfo *)0x0;
  }
  else {
    if ((fileType == SystemStreamDirectory) || (fileType == Directory)) {
      lVar5 = (long)local_68.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_68.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5;
    }
    else {
      lVar5 = ((long)local_68.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_68.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5) + -1;
    }
    if (lVar5 != 0) {
      lVar4 = 0;
      pFVar3 = this_00;
      do {
        name_00 = (string *)
                  ((long)&((local_68.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar4);
        this_00 = FileEntryInfo::subDirByName(pFVar3,name_00);
        if (this_00 == (FileEntryInfo *)0x0) {
          iVar2 = mkdir(this,(name_00->_M_dataplus)._M_p,(__mode_t)pFVar3);
          this_00 = (FileEntryInfo *)CONCAT44(extraout_var,iVar2);
        }
        lVar4 = lVar4 + 0x20;
        lVar5 = lVar5 + -1;
        pFVar3 = this_00;
      } while (lVar5 != 0);
    }
    pFVar3 = (FileEntryInfo *)0x0;
    if ((fileType != Directory) && (fileType != SystemStreamDirectory)) {
      pcVar1 = local_68.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1]._M_dataplus._M_p;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar1,
                 pcVar1 + local_68.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish[-1]._M_string_length);
      pFVar3 = this_00;
      if ((local_50._M_string_length != 0) &&
         (pFVar3 = FileEntryInfo::fileByName(this_00,&local_50), pFVar3 == (FileEntryInfo *)0x0)) {
        pFVar3 = createFileEntry(this,this_00,fileType);
        if (pFVar3 == (FileEntryInfo *)0x0) {
          pFVar3 = (FileEntryInfo *)0x0;
        }
        else {
          std::__cxx11::string::_M_assign((string *)&pFVar3->m_name);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  return pFVar3;
}

Assistant:

FileEntryInfo *IsoWriter::getEntryByName(const std::string &name, const FileTypes fileType)
{
    const std::vector<std::string> parts = splitStr(name.c_str(), '/');
    FileEntryInfo *entry = m_rootDirInfo;
    if (!entry)
        return nullptr;
    const bool isDir = fileType == FileTypes::Directory || fileType == FileTypes::SystemStreamDirectory;
    const size_t idxMax = isDir ? parts.size() : parts.size() - 1;
    for (size_t i = 0; i < idxMax; ++i)
    {
        FileEntryInfo *nextEntry = entry->subDirByName(parts[i]);
        if (!nextEntry)
            nextEntry = mkdir(parts[i].c_str(), entry);
        entry = nextEntry;
    }
    if (isDir)
        return nullptr;

    const std::string fileName = *parts.rbegin();
    if (fileName.empty())
        return entry;
    FileEntryInfo *fileEntry = entry->fileByName(fileName);
    if (!fileEntry)
    {
        fileEntry = createFileEntry(entry, fileType);
        if (!fileEntry)
            return nullptr;
        fileEntry->setName(fileName);
    }

    return fileEntry;
}